

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O1

uint32_t mpr_calculate_minimal_d_z_y(nhdp_domain *domain,neighbor_graph *graph,addr_node *y)

{
  oonf_log_source source;
  uint32_t uVar1;
  char *pcVar2;
  char *pcVar3;
  list_entity *plVar4;
  ulong uVar5;
  netaddr *src;
  netaddr_str nbuf1;
  netaddr_str nbuf2;
  
  uVar5 = (ulong)y->min_d_z_y;
  if (y->min_d_z_y == 0) {
    plVar4 = (graph->set_n1).list_head.next;
    if (plVar4->prev == (graph->set_n1).list_head.prev) {
      uVar5 = 0xffffffff;
      src = (netaddr *)0x0;
    }
    else {
      uVar5 = 0xffffffff;
      src = (netaddr *)0x0;
      do {
        uVar1 = (*graph->methods->calculate_d_x_y)(domain,graph,(n1_node *)&plVar4[-3].prev,y);
        if (uVar1 < (uint)uVar5) {
          uVar5 = (ulong)uVar1;
          src = (netaddr *)&plVar4[-3].prev;
        }
        plVar4 = plVar4->next;
      } while (plVar4->prev != (graph->set_n1).list_head.prev);
    }
    source = LOG_MPR;
    if (src == (netaddr *)0x0) {
      if ((log_global_mask[LOG_MPR] & 1) != 0) {
        pcVar2 = netaddr_to_prefixstring(&nbuf1,&y->addr,false);
        oonf_log(LOG_SEVERITY_DEBUG,source,"src/nhdp/mpr/neighbor-graph.c",0xce,(void *)0x0,0,
                 "minimal d_z_y(%s) = infinite",pcVar2);
      }
    }
    else if ((log_global_mask[LOG_MPR] & 1) != 0) {
      pcVar2 = netaddr_to_prefixstring(&nbuf1,&y->addr,false);
      pcVar3 = netaddr_to_prefixstring(&nbuf2,src,false);
      oonf_log(LOG_SEVERITY_DEBUG,source,"src/nhdp/mpr/neighbor-graph.c",0xcb,(void *)0x0,0,
               "minimal d_z_y(%s) = %s (cost %u)",pcVar2,pcVar3,uVar5);
    }
    y->min_d_z_y = (uint32_t)uVar5;
  }
  return (uint32_t)uVar5;
}

Assistant:

uint32_t
mpr_calculate_minimal_d_z_y(const struct nhdp_domain *domain, struct neighbor_graph *graph, struct addr_node *y) {
  struct n1_node *z_node;
  uint32_t d_z_y, min_d_z_y;
#ifdef OONF_LOG_DEBUG_INFO
  struct n1_node *remember;
  struct netaddr_str nbuf1, nbuf2;
#endif
  if (y->min_d_z_y) {
    return y->min_d_z_y;
  }

  min_d_z_y = RFC7181_METRIC_INFINITE_PATH;
#ifdef OONF_LOG_DEBUG_INFO
  remember = NULL;
#endif
  avl_for_each_element(&graph->set_n1, z_node, _avl_node) {
    d_z_y = graph->methods->calculate_d_x_y(domain, graph, z_node, y);
    if (d_z_y < min_d_z_y) {
      min_d_z_y = d_z_y;
#ifdef OONF_LOG_DEBUG_INFO
      remember = z_node;
#endif
    }
  }

#ifdef OONF_LOG_DEBUG_INFO
  if (remember) {
    OONF_DEBUG(LOG_MPR, "minimal d_z_y(%s) = %s (cost %u)", netaddr_to_string(&nbuf1, &y->addr),
      netaddr_to_string(&nbuf2, &remember->addr), min_d_z_y);
  }
  else {
    OONF_DEBUG(LOG_MPR, "minimal d_z_y(%s) = infinite", netaddr_to_string(&nbuf1, &y->addr));
  }
#endif
  y->min_d_z_y = min_d_z_y;
  return min_d_z_y;
}